

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

bool __thiscall CCoinsViewCache::Flush(CCoinsViewCache *this)

{
  long lVar1;
  byte bVar2;
  size_t *in_RDI;
  long in_FS_OFFSET;
  bool fOk;
  CoinsViewCacheCursor cursor;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  CCoinsViewCache *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CoinsViewCacheCursor::CoinsViewCacheCursor
            ((CoinsViewCacheCursor *)in_stack_ffffffffffffffd8,in_RDI,
             (CoinsCachePair *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
             (CCoinsMap *)in_RDI,(bool)in_stack_ffffffffffffffbf);
  bVar2 = (**(code **)(*(long *)in_RDI[1] + 0x20))
                    ((long *)in_RDI[1],&stack0xffffffffffffffd8,(long)in_RDI + 0x11);
  bVar2 = bVar2 & 1;
  if (bVar2 != 0) {
    std::
    unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
    ::clear((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
             *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    ReallocateCache(in_stack_ffffffffffffffd8);
  }
  in_RDI[0x38] = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewCache::Flush() {
    auto cursor{CoinsViewCacheCursor(cachedCoinsUsage, m_sentinel, cacheCoins, /*will_erase=*/true)};
    bool fOk = base->BatchWrite(cursor, hashBlock);
    if (fOk) {
        cacheCoins.clear();
        ReallocateCache();
    }
    cachedCoinsUsage = 0;
    return fOk;
}